

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

void __thiscall KDIS::NETWORK::Connection::bindSocket(Connection *this)

{
  KException *pKVar1;
  int *piVar2;
  KCHAR8 *pKVar3;
  allocator<char> local_79;
  KString local_78;
  undefined1 local_58 [8];
  sockaddr_in Address;
  KString local_38;
  int local_18;
  undefined4 local_14;
  KINT32 iRet;
  KINT32 yes;
  Connection *this_local;
  
  local_14 = 1;
  _iRet = this;
  local_18 = setsockopt(this->m_iSocket[1],1,2,&local_14,4);
  if (local_18 == -1) {
    Address.sin_zero[2] = '\x01';
    pKVar1 = (KException *)__cxa_allocate_exception(0x30);
    piVar2 = __errno_location();
    pKVar3 = getErrorText(this,*piVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,pKVar3,(allocator<char> *)(Address.sin_zero + 3));
    KException::KException(pKVar1,&local_38,0xc);
    Address.sin_zero[2] = '\0';
    __cxa_throw(pKVar1,&KException::typeinfo,KException::~KException);
  }
  memset(local_58,0,0x10);
  local_58._0_2_ = 2;
  local_58._4_4_ = htonl(0);
  local_58._2_2_ = htons((uint16_t)this->m_uiPort);
  local_18 = bind(this->m_iSocket[1],(sockaddr *)local_58,0x10);
  if (local_18 == -1) {
    pKVar1 = (KException *)__cxa_allocate_exception(0x30);
    piVar2 = __errno_location();
    pKVar3 = getErrorText(this,*piVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pKVar3,&local_79);
    KException::KException(pKVar1,&local_78,0xc);
    __cxa_throw(pKVar1,&KException::typeinfo,KException::~KException);
  }
  return;
}

Assistant:

void Connection::bindSocket()
{
    // Set the receive socket to be reusable. Useful if your server has
    // been shut down, and then restarted right away.
    KINT32 yes = 1;
    KINT32 iRet = setsockopt( m_iSocket[RECEIVE_SOCK], SOL_SOCKET, SO_REUSEADDR, ( const char * )&yes, sizeof( yes ) );
    if( iRet == SOCKET_ERROR )
    {
        THROW_ERROR;
    }

    // Construct bind structure
    sockaddr_in Address;
    memset( &Address, 0, sizeof( Address ) );
    Address.sin_family = AF_INET;                   // Internet address family
    Address.sin_addr.s_addr = htonl( INADDR_ANY );  // Any incoming interface
    Address.sin_port = htons( m_uiPort );           // Listen Port

    // Now bind
    iRet = bind( m_iSocket[RECEIVE_SOCK], ( sockaddr* )&Address, sizeof( Address ) );
    if( iRet == SOCKET_ERROR )
    {
        THROW_ERROR;
    }
}